

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::IssueCMP0095Warning(cmInstallTargetGenerator *this,string *unescapedRpath)

{
  long lVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  string local_1e8;
  string local_1b8;
  undefined1 local_198 [8];
  ostringstream w;
  bool potentially_affected;
  string *unescapedRpath_local;
  cmInstallTargetGenerator *this_local;
  
  lVar1 = std::__cxx11::string::find((char *)unescapedRpath,0x84060e);
  if (lVar1 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b8,(cmPolicies *)0x5f,id);
    poVar2 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1b8);
    poVar2 = std::operator<<((ostream *)local_198,"RPATH entries for target \'");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\' ");
    poVar2 = std::operator<<(poVar2,"will not be escaped in the intermediary ");
    std::operator<<(poVar2,"cmake_install.cmake script.");
    this_00 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
    this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
    std::__cxx11::ostringstream::str();
    backtrace = GetBacktrace(this);
    cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1e8,backtrace);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::IssueCMP0095Warning(
  const std::string& unescapedRpath)
{
  // Reduce warning noise to cases where used RPATHs may actually be affected
  // by CMP0095. This filter is meant to skip warnings in cases when
  // non-curly-braces syntax (e.g. $ORIGIN) or no keyword is used which has
  // worked already before CMP0095. We intend to issue a warning in all cases
  // with curly-braces syntax, even if the workaround of double-escaping is in
  // place, since we deprecate the need for it with CMP0095.
  const bool potentially_affected(unescapedRpath.find("${") !=
                                  std::string::npos);

  if (potentially_affected) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0095) << "\n";
    w << "RPATH entries for target '" << this->Target->GetName() << "' "
      << "will not be escaped in the intermediary "
      << "cmake_install.cmake script.";
    this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());
  }
}